

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O0

size_t __thiscall cppurses::Text_display::last_index_at(Text_display *this,size_t line)

{
  size_type sVar1;
  const_reference pvVar2;
  size_t next_line;
  size_t line_local;
  Text_display *this_local;
  
  sVar1 = std::
          vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
          ::size(&this->display_state_);
  if (line + 1 < sVar1) {
    pvVar2 = std::
             vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
             ::at(&this->display_state_,line + 1);
    this_local = (Text_display *)pvVar2->start_index;
  }
  else {
    this_local = (Text_display *)end_index(this);
  }
  return (size_t)this_local;
}

Assistant:

std::size_t Text_display::last_index_at(std::size_t line) const {
    const auto next_line = line + 1;
    if (next_line >= display_state_.size()) {
        return this->end_index();
    }
    return display_state_.at(next_line).start_index;
}